

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

bool cfd::core::IsBigEndian(void)

{
  uint8_t buf [4];
  
  if (IsBigEndian::is_big_endian == (bool *)0x0) {
    IsBigEndian::is_big_endian = &IsBigEndian::kFalse;
  }
  return (bool)(*IsBigEndian::is_big_endian & 1);
}

Assistant:

static bool IsBigEndian() {
  static const uint32_t k32bitValue = 0x04030201;
  static bool* is_big_endian = nullptr;
  static bool kTrue = true;
  static bool kFalse = false;
  if (is_big_endian == nullptr) {
    uint8_t buf[4];
    memcpy(buf, &k32bitValue, sizeof(buf));
    if (buf[0] == 1) {
      // little
      is_big_endian = &kFalse;
    } else {
      is_big_endian = &kTrue;
    }
  }
  return *is_big_endian;
}